

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::upsample(Mesh *this)

{
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar1;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar2;
  Scene *pSVar3;
  XFormWidget *pXVar4;
  Size SVar5;
  ostream *poVar6;
  _List_node_base *p_Var7;
  
  plVar1 = &(this->mesh).faces;
  p_Var7 = (_List_node_base *)plVar1;
  do {
    p_Var7 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var7->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var7 == (_List_node_base *)plVar1) {
      MeshResampler::upsample((MeshResampler *)&this->field_0x1f0,&this->mesh);
      plVar2 = &(this->mesh).vertices;
      p_Var7 = (_List_node_base *)plVar2;
      while (p_Var7 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                       &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var7 != (_List_node_base *)plVar2) {
        p_Var7[4]._M_next = p_Var7[2]._M_prev;
        p_Var7[3]._M_next = p_Var7[1]._M_prev;
        p_Var7[3]._M_prev = p_Var7[2]._M_next;
      }
      pSVar3 = (this->super_SceneObject).scene;
      (pSVar3->selected).coordinates.x = 0.0;
      (pSVar3->selected).coordinates.y = 0.0;
      (pSVar3->selected).object = (SceneObject *)0x0;
      (pSVar3->selected).element = (HalfedgeElement *)0x0;
      (pSVar3->selected).coordinates.z = 0.0;
      (pSVar3->selected).axis = None;
      pSVar3 = (this->super_SceneObject).scene;
      (pSVar3->hovered).coordinates.x = 0.0;
      (pSVar3->hovered).coordinates.y = 0.0;
      (pSVar3->hovered).object = (SceneObject *)0x0;
      (pSVar3->hovered).element = (HalfedgeElement *)0x0;
      (pSVar3->hovered).coordinates.z = 0.0;
      (pSVar3->hovered).axis = None;
      pXVar4 = ((this->super_SceneObject).scene)->elementTransform;
      (pXVar4->target).coordinates.x = 0.0;
      (pXVar4->target).coordinates.y = 0.0;
      (pXVar4->target).object = (SceneObject *)0x0;
      (pXVar4->target).element = (HalfedgeElement *)0x0;
      (pXVar4->target).coordinates.z = 0.0;
      (pXVar4->target).axis = None;
      return;
    }
    SVar5 = Face::degree((Face *)(p_Var7 + 1));
  } while (SVar5 == 3);
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Warning: refusing to apply Loop subdivision to surface with non-triangular faces!"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cerr,"(Try triangulating first.)");
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void Mesh::upsample() {
  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if (f->degree() != 3) {
      cerr << "Warning: refusing to apply Loop subdivision to surface with "
              "non-triangular faces!"
           << endl;
      cerr << "(Try triangulating first.)" << endl;
      return;
    }
  }
  resampler.upsample(mesh);
  // Make sure the bind position is set
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->bindPosition = v->position;
  }
  scene->selected.clear();
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}